

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpendableReload.cpp
# Opt level: O1

void __thiscall DIS::ExpendableReload::marshal(ExpendableReload *this,DataStream *dataStream)

{
  EntityType::marshal(&this->_expendable,dataStream);
  DataStream::operator<<(dataStream,this->_station);
  DataStream::operator<<(dataStream,this->_standardQuantity);
  DataStream::operator<<(dataStream,this->_maximumQuantity);
  DataStream::operator<<(dataStream,this->_standardQuantityReloadTime);
  DataStream::operator<<(dataStream,this->_maximumQuantityReloadTime);
  return;
}

Assistant:

void ExpendableReload::marshal(DataStream& dataStream) const
{
    _expendable.marshal(dataStream);
    dataStream << _station;
    dataStream << _standardQuantity;
    dataStream << _maximumQuantity;
    dataStream << _standardQuantityReloadTime;
    dataStream << _maximumQuantityReloadTime;
}